

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O2

string * __thiscall
booster::aio::endpoint::path_abi_cxx11_(string *__return_storage_ptr__,endpoint *this)

{
  family_type fVar1;
  endpoint *this_00;
  allocator local_11;
  
  this_00 = this;
  fVar1 = family(this);
  if (fVar1 == pf_unix) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(((this->d).ptr_)->sa).un.sun_path,&local_11);
    return __return_storage_ptr__;
  }
  throw_invalid(this_00);
}

Assistant:

std::string endpoint::path() const
{
	if(family()!=pf_unix)
		throw_invalid();
	return d->sa.un.sun_path;
}